

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

char * __thiscall
fmt::v7::detail::
format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
::on_format_specs(format_handler<fmt::v7::detail::arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>,_char,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
                  *this,int id,char *begin,char *end)

{
  size_t *psVar1;
  basic_format_parse_context<char,_fmt::v7::detail::error_handler> *pbVar2;
  basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> *pbVar3;
  char *pcVar4;
  undefined1 value [16];
  undefined1 value_00 [16];
  basic_format_specs<char> specs_00;
  basic_format_specs<char> specs_01;
  basic_format_specs<char> specs_02;
  handle handle;
  basic_string_view<char> value_01;
  long lVar5;
  char *pcVar6;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  *__return_storage_ptr__;
  basic_format_specs<char> specs;
  format_arg arg;
  unkbyte10 in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff42;
  format_specs local_b8;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_1
  local_a8;
  type local_98;
  arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char> local_88;
  specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
  local_58;
  
  pcVar6 = (this->parse_context).format_str_.data_;
  lVar5 = (long)begin - (long)pcVar6;
  if (-1 < lVar5) {
    (this->parse_context).format_str_.data_ = pcVar6 + lVar5;
    psVar1 = &(this->parse_context).format_str_.size_;
    *psVar1 = *psVar1 - lVar5;
    pbVar2 = &this->parse_context;
    pbVar3 = &this->context;
    __return_storage_ptr__ = &local_a8;
    basic_format_args<fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
    ::get((format_arg *)&__return_storage_ptr__->string,&(this->context).args_,id);
    if (local_98 == custom_type) {
      (*(code *)CONCAT62(local_a8.int128_value._10_6_,local_a8.int128_value._8_2_))
                (CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),pbVar2,pbVar3);
      pcVar6 = (pbVar2->format_str_).data_;
    }
    else {
      if (local_98 == none_type) {
        error_handler::on_error
                  ((error_handler *)&__return_storage_ptr__->string,"argument not found");
      }
      local_b8.width = 0;
      local_b8.precision = -1;
      local_b8.type = '\0';
      local_b8._9_1_ = 0;
      local_b8.fill.size_ = '\x01';
      local_b8.fill.data_[0] = ' ';
      local_b8.fill.data_[1] = '\0';
      local_b8.fill.data_[2] = '\0';
      local_b8.fill.data_[3] = '\0';
      local_58.checker_.error_handler_ =
           &local_58.
            super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      ;
      local_58.checker_.arg_type_ = local_98;
      local_58.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      .super_specs_setter<char>.specs_ = &local_b8;
      local_58.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      .parse_context_ = pbVar2;
      local_58.
      super_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>
      .context_ = pbVar3;
      pcVar6 = parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>,fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char>>>&>
                         (begin,end,
                          (specs_checker<fmt::v7::detail::specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>,_fmt::v7::basic_format_context<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>_>_>
                           *)local_58.checker_.error_handler_);
      if ((pcVar6 == end) || (*pcVar6 != '}')) {
        error_handler::on_error((error_handler *)begin,"missing \'}\' in format string");
      }
      pcVar4 = (pbVar2->format_str_).data_;
      lVar5 = (long)pcVar6 - (long)pcVar4;
      if (lVar5 < 0) goto LAB_0011680d;
      (this->parse_context).format_str_.data_ = pcVar4 + lVar5;
      psVar1 = &(this->parse_context).format_str_.size_;
      *psVar1 = *psVar1 - lVar5;
      local_88.
      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      .out_.container = (this->context).out_.container;
      local_88.
      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      .locale_.locale_ = (this->context).loc_.locale_;
      local_88.ptr_ = (char *)0x0;
      local_88.
      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
      .specs_ = &local_b8;
      local_88.ctx_ = pbVar3;
      local_88.parse_ctx_ = pbVar2;
      switch(local_98) {
      case int_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<int>(&local_88.
                          super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                         ,local_a8.int_value,&local_b8);
        break;
      case uint_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_int>
                  (&local_88.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,local_a8.uint_value,&local_b8);
        break;
      case long_long_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<long_long>
                  (&local_88.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),&local_b8);
        break;
      case ulong_long_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<unsigned_long_long>
                  (&local_88.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),&local_b8);
        break;
      case int128_type:
        value._10_6_ = in_stack_ffffffffffffff42;
        value._0_10_ = in_stack_ffffffffffffff38;
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::write_int<__int128>
                  (&local_88.
                    super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   ,(__int128)value,
                   (format_specs *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
        break;
      case uint128_type:
        value_00._10_6_ = in_stack_ffffffffffffff42;
        value_00._0_10_ = in_stack_ffffffffffffff38;
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>
        ::write_int<unsigned__int128>
                  ((arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::error_handler>
                    *)&local_88,(unsigned___int128)value_00,
                   (format_specs *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
        break;
      case bool_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::operator()(&local_88.
                      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                     ,local_a8.bool_value);
        break;
      case char_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::operator()(&local_88.
                      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                     ,local_a8.char_value);
        break;
      case float_type:
        specs_02.type = local_b8.type;
        specs_02._9_1_ = local_b8._9_1_;
        specs_02.width = local_b8.width;
        specs_02.precision = local_b8.precision;
        specs_02.fill.data_[0] = local_b8.fill.data_[0];
        specs_02.fill.data_[1] = local_b8.fill.data_[1];
        specs_02.fill.data_[2] = local_b8.fill.data_[2];
        specs_02.fill.data_[3] = local_b8.fill.data_[3];
        specs_02.fill.size_ = local_b8.fill.size_;
        specs_02._15_1_ = local_b8._15_1_;
        write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_float,_0>
                  ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                   local_88.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .out_.container,local_a8.float_value,specs_02,
                   local_88.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .locale_);
        break;
      case double_type:
        specs_00.type = local_b8.type;
        specs_00._9_1_ = local_b8._9_1_;
        specs_00.width = local_b8.width;
        specs_00.precision = local_b8.precision;
        specs_00.fill.data_[0] = local_b8.fill.data_[0];
        specs_00.fill.data_[1] = local_b8.fill.data_[1];
        specs_00.fill.data_[2] = local_b8.fill.data_[2];
        specs_00.fill.data_[3] = local_b8.fill.data_[3];
        specs_00.fill.size_ = local_b8.fill.size_;
        specs_00._15_1_ = local_b8._15_1_;
        write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_double,_0>
                  ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                   local_88.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .out_.container,
                   (double)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value),specs_00,
                   local_88.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .locale_);
        break;
      case last_numeric_type:
        specs_01.type = local_b8.type;
        specs_01._9_1_ = local_b8._9_1_;
        specs_01.width = local_b8.width;
        specs_01.precision = local_b8.precision;
        specs_01.fill.data_[0] = local_b8.fill.data_[0];
        specs_01.fill.data_[1] = local_b8.fill.data_[1];
        specs_01.fill.data_[2] = local_b8.fill.data_[2];
        specs_01.fill.data_[3] = local_b8.fill.data_[3];
        specs_01.fill.size_ = local_b8.fill.size_;
        specs_01._15_1_ = local_b8._15_1_;
        write<char,_std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_long_double,_0>
                  ((back_insert_iterator<fmt::v7::detail::buffer<char>_>)
                   local_88.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .out_.container,
                   (longdouble)
                   CONCAT28(local_a8.int128_value._8_2_,
                            CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value)),specs_01,
                   local_88.
                   super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                   .locale_);
        break;
      case cstring_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::operator()(&local_88.
                      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                     ,(char *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
        break;
      case string_type:
        value_01.data_._4_4_ = local_a8.long_long_value._4_4_;
        value_01.data_._0_4_ = local_a8.int_value;
        value_01.size_._0_2_ = local_a8.int128_value._8_2_;
        value_01.size_._2_6_ = local_a8.int128_value._10_6_;
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::operator()(&local_88.
                      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                     ,value_01);
        break;
      case pointer_type:
        arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
        ::operator()(&local_88.
                      super_arg_formatter_base<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_fmt::v7::detail::error_handler>
                     ,(void *)CONCAT44(local_a8.long_long_value._4_4_,local_a8.int_value));
        break;
      case custom_type:
        handle.custom_.value._4_4_ = local_a8.long_long_value._4_4_;
        handle.custom_.value._0_4_ = local_a8.int_value;
        handle.custom_.format._0_2_ = local_a8.int128_value._8_2_;
        handle.custom_.format._2_6_ = local_a8.int128_value._10_6_;
        arg_formatter<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char>::operator()
                  (&local_88,handle);
        break;
      default:
        assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/format.h"
                    ,0x798,"invalid argument type");
      }
    }
    return pcVar6;
  }
LAB_0011680d:
  assert_fail("/workspace/llm4binary/github/license_all_cmakelists_1510/robertoraggi[P]pgen/build_O1/_deps/fmt-src/include/fmt/core.h"
              ,0x13d,"negative value");
}

Assistant:

const Char* on_format_specs(int id, const Char* begin, const Char* end) {
    advance_to(parse_context, begin);
    auto arg = get_arg(context, id);
    custom_formatter<Context> f(parse_context, context);
    if (visit_format_arg(f, arg)) return parse_context.begin();
    basic_format_specs<Char> specs;
    using parse_context_t = basic_format_parse_context<Char>;
    specs_checker<specs_handler<parse_context_t, Context>> handler(
        specs_handler<parse_context_t, Context>(specs, parse_context, context),
        arg.type());
    begin = parse_format_specs(begin, end, handler);
    if (begin == end || *begin != '}') on_error("missing '}' in format string");
    advance_to(parse_context, begin);
    context.advance_to(
        visit_format_arg(ArgFormatter(context, &parse_context, &specs), arg));
    return begin;
  }